

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::FindProvidesForFields
          (Generator *this,GeneratorOptions *options,Printer *printer,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *provided)

{
  pointer ppFVar1;
  FieldDescriptor *field;
  bool bVar2;
  FieldDescriptor *file;
  GeneratorOptions *options_00;
  FileDescriptor *pFVar3;
  string name;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pFVar3 = (FileDescriptor *)0x0;
  while( true ) {
    ppFVar1 = (fields->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    file = (FieldDescriptor *)
           ((long)(fields->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
    if (file <= pFVar3) break;
    field = ppFVar1[(long)pFVar3];
    bVar2 = anon_unknown_0::IgnoreField(field);
    if (!bVar2) {
      (anonymous_namespace)::GetFilePath_abi_cxx11_
                (&local_a8,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x30),
                 (FileDescriptor *)file);
      std::operator+(&local_68,&local_a8,".");
      (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                (&local_88,(_anonymous_namespace_ *)field,options_00,file);
      std::operator+(&local_48,&local_68,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_a8);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)provided,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    pFVar3 = pFVar3 + 1;
  }
  return;
}

Assistant:

void Generator::FindProvidesForFields(
    const GeneratorOptions& options,
    io::Printer* printer,
    const std::vector<const FieldDescriptor*>& fields,
    std::set<string>* provided) const {
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];

    if (IgnoreField(field)) {
      continue;
    }

    string name = GetFilePath(options, field->file()) + "." +
                  JSObjectFieldName(options, field);
    provided->insert(name);
  }
}